

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# convolution_3x3_pack8.h
# Opt level: O0

void ncnn::conv3x3s1_winograd63_transform_kernel_pack8_avx
               (Mat *kernel,Mat *kernel_tm_pack8,int inch,int outch,Option *opt)

{
  int in_ECX;
  long lVar1;
  int in_EDX;
  long *in_RSI;
  long *in_RDI;
  float *k00;
  int j_1;
  int i_2;
  int p_1;
  float *g00;
  int k;
  Mat g0;
  int q_1;
  int i_1;
  float *tmpp;
  int j;
  int i;
  float tmp [8] [3];
  float *k2;
  float *k1;
  float *k0;
  float *kernel_tm0;
  float *kernel0;
  int q;
  int p;
  float ktm [8] [3];
  Mat kernel_tm;
  Mat *m_2;
  Mat *m_1;
  Mat *m;
  Allocator *in_stack_fffffffffffffa70;
  int _elempack;
  size_t in_stack_fffffffffffffa78;
  undefined8 in_stack_fffffffffffffa80;
  int _c;
  undefined8 in_stack_fffffffffffffa88;
  Mat *in_stack_fffffffffffffa90;
  Allocator *_allocator;
  undefined8 local_508;
  undefined8 local_500;
  undefined8 local_4f8;
  undefined4 local_4f0;
  long *local_4e8;
  undefined4 local_4e0;
  undefined4 local_4dc;
  undefined4 local_4d8;
  undefined4 local_4d4;
  undefined4 local_4d0;
  undefined8 local_4c8;
  _func_int **local_4c0;
  int local_4b4;
  int local_4b0;
  int local_4ac;
  undefined4 *local_4a8;
  int local_49c;
  undefined8 local_498;
  undefined8 local_490;
  undefined8 local_488;
  undefined4 local_480;
  long local_478;
  undefined4 local_470;
  undefined4 local_46c;
  undefined4 local_468;
  undefined4 local_464;
  undefined4 local_460;
  undefined8 local_458;
  int local_450;
  int local_44c;
  float *local_448;
  int local_440;
  int local_43c;
  float local_438 [26];
  float *local_3d0;
  float *local_3c8;
  float *local_3c0;
  undefined8 local_3b8;
  undefined8 local_3b0;
  undefined8 local_3a8;
  undefined4 local_3a0;
  long *local_398;
  undefined4 local_390;
  undefined4 local_38c;
  undefined4 local_388;
  undefined4 local_384;
  undefined4 local_380;
  undefined8 local_378;
  _func_int **local_370;
  float *local_368;
  int local_360;
  int local_35c;
  float local_358 [28];
  Allocator local_2e8;
  int *local_2e0;
  long local_2d8;
  undefined4 local_2d0;
  long *local_2c8;
  undefined4 local_2c0;
  int local_2bc;
  int local_2b8;
  undefined4 local_2b4;
  undefined4 local_2b0;
  long local_2a8;
  int local_298;
  int local_294;
  long *local_290;
  long *local_288;
  Allocator *local_280;
  undefined8 *local_278;
  undefined8 *local_270;
  undefined8 *local_268;
  Allocator *local_258;
  int local_238;
  undefined4 local_234;
  Allocator *local_230;
  undefined8 *local_210;
  undefined8 *local_200;
  undefined8 *local_1f0;
  undefined1 local_1e5;
  int local_1e4;
  Allocator *local_1e0;
  undefined8 *local_1d8;
  undefined1 local_1b5;
  int local_1b4;
  undefined8 *local_1a8;
  undefined1 local_185;
  int local_184;
  Allocator *local_180;
  undefined8 *local_178;
  _func_int **local_118;
  int local_104;
  undefined8 *local_100;
  int local_f4;
  undefined8 *local_f0;
  int local_e4;
  undefined8 *local_e0;
  long *local_d8;
  undefined4 local_cc;
  long local_c8;
  _func_int **local_c0;
  undefined4 local_b4;
  int local_b0;
  int local_ac;
  undefined8 *local_a8;
  long local_a0;
  undefined4 local_94;
  long local_90;
  long local_88;
  undefined4 local_7c;
  int local_78;
  int local_74;
  undefined8 *local_70;
  long *local_68;
  undefined4 local_5c;
  long local_58;
  _func_int **local_50;
  undefined4 local_44;
  int local_40;
  int local_3c;
  undefined8 *local_38;
  undefined4 local_2c;
  long local_28;
  undefined4 local_1c;
  long local_18;
  undefined4 local_c;
  long local_8;
  
  _c = (int)((ulong)in_stack_fffffffffffffa80 >> 0x20);
  _allocator = &local_2e8;
  local_2e8._vptr_Allocator = (_func_int **)0x0;
  local_2e0 = (int *)0x0;
  local_2d8 = 0;
  local_2d0 = 0;
  local_2c8 = (long *)0x0;
  local_2c0 = 0;
  local_2bc = 0;
  local_2b8 = 0;
  local_2b4 = 0;
  local_2b0 = 0;
  local_2a8 = 0;
  local_298 = in_ECX;
  local_294 = in_EDX;
  local_290 = in_RSI;
  local_288 = in_RDI;
  local_280 = _allocator;
  Mat::create(in_stack_fffffffffffffa90,(int)((ulong)in_stack_fffffffffffffa88 >> 0x20),
              (int)in_stack_fffffffffffffa88,_c,in_stack_fffffffffffffa78,in_stack_fffffffffffffa70)
  ;
  _elempack = (int)((ulong)in_stack_fffffffffffffa70 >> 0x20);
  memcpy(local_358,&DAT_01f0fc80,0x60);
  for (local_35c = 0; local_35c < local_298; local_35c = local_35c + 1) {
    for (local_360 = 0; local_360 < local_294; local_360 = local_360 + 1) {
      local_3c0 = (float *)(*local_288 + (long)(local_35c * local_294 * 9) * 4 +
                           (long)(local_360 * 9) * 4);
      local_178 = &local_3b8;
      local_180 = &local_2e8;
      local_c0 = local_2e8._vptr_Allocator + local_2a8 * local_35c * local_2d8;
      local_a8 = &local_3b8;
      local_8 = (long)local_2bc * (long)local_2b8 * local_2d8;
      local_398 = local_2c8;
      local_c = 0x10;
      local_ac = local_2bc;
      local_b0 = local_2b8;
      local_b4 = local_2b4;
      local_c8 = local_2d8;
      local_cc = local_2d0;
      local_d8 = local_2c8;
      local_184 = local_35c;
      local_185 = 1;
      local_f0 = &local_3b8;
      local_f4 = local_360;
      local_370 = (_func_int **)((long)local_c0 + (long)local_2bc * (long)local_360 * local_2d8);
      local_278 = &local_3b8;
      local_3b8 = 0;
      local_3a8 = 0;
      local_3a0 = 0;
      local_390 = 0;
      local_38c = 0;
      local_388 = 0;
      local_384 = 0;
      local_380 = 0;
      local_378 = 0;
      local_3b0 = 0;
      local_3c8 = local_3c0 + 3;
      local_3d0 = local_3c0 + 6;
      for (local_43c = 0; local_43c < 8; local_43c = local_43c + 1) {
        local_438[(long)local_43c * 3] =
             *local_3c0 * local_358[(long)local_43c * 3] +
             local_3c0[1] * local_358[(long)local_43c * 3 + 1] +
             local_3c0[2] * local_358[(long)local_43c * 3 + 2];
        local_438[(long)local_43c * 3 + 1] =
             *local_3c8 * local_358[(long)local_43c * 3] +
             local_3c0[4] * local_358[(long)local_43c * 3 + 1] +
             local_3c0[5] * local_358[(long)local_43c * 3 + 2];
        local_438[(long)local_43c * 3 + 2] =
             *local_3d0 * local_358[(long)local_43c * 3] +
             local_3c0[7] * local_358[(long)local_43c * 3 + 1] +
             local_3c0[8] * local_358[(long)local_43c * 3 + 2];
      }
      for (local_440 = 0; local_440 < 8; local_440 = local_440 + 1) {
        lVar1 = (long)local_440;
        local_448 = local_438 + lVar1 * 3;
        for (local_44c = 0; local_44c < 8; local_44c = local_44c + 1) {
          *(float *)((long)local_370 + (long)(local_440 * 8 + local_44c) * 4) =
               *local_448 * local_358[(long)local_44c * 3] +
               local_438[lVar1 * 3 + 1] * local_358[(long)local_44c * 3 + 1] +
               local_438[lVar1 * 3 + 2] * local_358[(long)local_44c * 3 + 2];
        }
      }
      local_368 = local_3c0;
      local_1f0 = local_278;
    }
  }
  Mat::create(in_stack_fffffffffffffa90,(int)((ulong)in_stack_fffffffffffffa88 >> 0x20),
              (int)in_stack_fffffffffffffa88,_c,in_stack_fffffffffffffa78,_elempack,_allocator);
  for (local_450 = 0; local_450 + 7 < local_298; local_450 = local_450 + 8) {
    local_1b4 = local_450 / 8;
    local_1a8 = &local_498;
    local_74 = *(int *)((long)local_290 + 0x2c);
    local_78 = (int)local_290[6];
    local_7c = *(undefined4 *)((long)local_290 + 0x34);
    local_88 = *local_290 + local_290[8] * (long)local_1b4 * local_290[2];
    local_90 = local_290[2];
    local_94 = (undefined4)local_290[3];
    local_a0 = local_290[4];
    local_70 = &local_498;
    local_18 = (long)local_74 * (long)local_78 * local_90;
    for (local_49c = 0; local_49c < 0x40; local_49c = local_49c + 1) {
      local_e0 = &local_498;
      local_e4 = local_49c;
      local_4a8 = (undefined4 *)(local_88 + (long)local_74 * (long)local_49c * local_90);
      for (local_4ac = 0; local_4ac + 7 < local_294; local_4ac = local_4ac + 8) {
        for (local_4b0 = 0; local_4b0 < 8; local_4b0 = local_4b0 + 1) {
          for (local_4b4 = 0; local_4b4 < 8; local_4b4 = local_4b4 + 1) {
            local_1e4 = local_450 + local_4b4;
            local_1d8 = &local_508;
            local_1e0 = &local_2e8;
            local_50 = local_2e8._vptr_Allocator + local_2a8 * local_1e4 * local_2d8;
            local_38 = &local_508;
            local_28 = (long)local_2bc * (long)local_2b8 * local_2d8;
            local_104 = local_4ac + local_4b0;
            local_100 = &local_508;
            local_4c0 = (_func_int **)
                        ((long)local_50 + (long)local_2bc * (long)local_104 * local_2d8);
            local_270 = &local_508;
            local_4e8 = local_2c8;
            local_2c = 0x10;
            local_3c = local_2bc;
            local_40 = local_2b8;
            local_44 = local_2b4;
            local_58 = local_2d8;
            local_5c = local_2d0;
            local_68 = local_2c8;
            local_1e5 = 1;
            local_508 = 0;
            local_4f8 = 0;
            local_4f0 = 0;
            local_4e0 = 0;
            local_4dc = 0;
            local_4d8 = 0;
            local_4d4 = 0;
            local_4d0 = 0;
            local_4c8 = 0;
            local_500 = 0;
            *local_4a8 = *(undefined4 *)((long)local_4c0 + (long)local_49c * 4);
            local_4a8 = local_4a8 + 1;
            local_200 = local_270;
          }
        }
      }
    }
    local_268 = &local_498;
    local_1c = 0x10;
    local_1b5 = 1;
    local_498 = 0;
    local_488 = 0;
    local_480 = 0;
    local_470 = 0;
    local_46c = 0;
    local_468 = 0;
    local_464 = 0;
    local_460 = 0;
    local_458 = 0;
    local_490 = 0;
    local_210 = local_268;
    local_478 = local_a0;
  }
  local_258 = &local_2e8;
  if (local_2e0 != (int *)0x0) {
    local_234 = 0xffffffff;
    LOCK();
    local_238 = *local_2e0;
    *local_2e0 = *local_2e0 + -1;
    UNLOCK();
    if (local_238 == 1) {
      local_230 = local_258;
      if (local_2c8 == (long *)0x0) {
        local_118 = local_2e8._vptr_Allocator;
        if (local_2e8._vptr_Allocator != (_func_int **)0x0) {
          free(local_2e8._vptr_Allocator);
        }
      }
      else {
        (**(code **)(*local_2c8 + 0x18))(local_2c8,local_2e8._vptr_Allocator);
      }
    }
  }
  return;
}

Assistant:

static void conv3x3s1_winograd63_transform_kernel_pack8_avx(const Mat& kernel, Mat& kernel_tm_pack8, int inch, int outch, const Option& opt)
{
    // winograd63 transform kernel
    Mat kernel_tm;
    kernel_tm.create(8 * 8, inch, outch);

    const float ktm[8][3] = {
        {1.0f, 0.0f, 0.0f},
        {-2.0f / 9, -2.0f / 9, -2.0f / 9},
        {-2.0f / 9, 2.0f / 9, -2.0f / 9},
        {1.0f / 90, 1.0f / 45, 2.0f / 45},
        {1.0f / 90, -1.0f / 45, 2.0f / 45},
        {1.0f / 45, 1.0f / 90, 1.0f / 180},
        {1.0f / 45, -1.0f / 90, 1.0f / 180},
        {0.0f, 0.0f, 1.0f}
    };

    #pragma omp parallel for num_threads(opt.num_threads)
    for (int p = 0; p < outch; p++)
    {
        for (int q = 0; q < inch; q++)
        {
            const float* kernel0 = (const float*)kernel + p * inch * 9 + q * 9;
            float* kernel_tm0 = kernel_tm.channel(p).row(q);

            // transform kernel, transposed
            const float* k0 = kernel0;
            const float* k1 = kernel0 + 3;
            const float* k2 = kernel0 + 6;

            // h
            float tmp[8][3];
            for (int i = 0; i < 8; i++)
            {
                tmp[i][0] = k0[0] * ktm[i][0] + k0[1] * ktm[i][1] + k0[2] * ktm[i][2];
                tmp[i][1] = k1[0] * ktm[i][0] + k1[1] * ktm[i][1] + k1[2] * ktm[i][2];
                tmp[i][2] = k2[0] * ktm[i][0] + k2[1] * ktm[i][1] + k2[2] * ktm[i][2];
            }

            // v
            for (int j = 0; j < 8; j++)
            {
                float* tmpp = &tmp[j][0];

                for (int i = 0; i < 8; i++)
                {
                    kernel_tm0[j * 8 + i] = tmpp[0] * ktm[i][0] + tmpp[1] * ktm[i][1] + tmpp[2] * ktm[i][2];
                }
            }
        }
    }

    // interleave
    // src = 64-inch-outch
    // dst = 8b-8a-inch/8a-64-outch/8b
    kernel_tm_pack8.create(inch / 8, 64, outch / 8, (size_t)4u * 64, 64);
    for (int q = 0; q + 7 < outch; q += 8)
    {
        Mat g0 = kernel_tm_pack8.channel(q / 8);

        for (int k = 0; k < 64; k++)
        {
            float* g00 = g0.row<float>(k);

            for (int p = 0; p + 7 < inch; p += 8)
            {
                for (int i = 0; i < 8; i++)
                {
                    for (int j = 0; j < 8; j++)
                    {
                        const float* k00 = kernel_tm.channel(q + j).row(p + i);
                        g00[0] = k00[k];
                        g00++;
                    }
                }
            }
        }
    }
}